

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

cmListFileContext *
cmListFileContext::FromListFileFunction
          (cmListFileContext *__return_storage_ptr__,cmListFileFunction *lff,string *fileName,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  cmListFileContext(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->FilePath);
  __return_storage_ptr__->Line =
       ((lff->Impl).
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->Line;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__return_storage_ptr__->DeferId,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)deferId);
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromListFileFunction(
    cmListFileFunction const& lff, std::string const& fileName,
    cm::optional<std::string> deferId = {})
  {
    cmListFileContext lfc;
    lfc.FilePath = fileName;
    lfc.Line = lff.Line();
    lfc.Name = lff.OriginalName();
    lfc.DeferId = std::move(deferId);
    return lfc;
  }